

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofR.cpp
# Opt level: O2

void __thiscall OpenMD::GofR::collectHistogram(GofR *this,StuntDouble *sd1,StuntDouble *sd2)

{
  int *piVar1;
  char cVar2;
  double dVar3;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> VStack_88;
  Vector<double,_3U> local_70;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_40;
  
  if (sd1 != sd2) {
    cVar2 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    StuntDouble::getPos((Vector3d *)&local_40,sd1);
    StuntDouble::getPos((Vector3d *)&local_58,sd2);
    operator-(&local_70,&local_58,&local_40);
    Vector<double,_3U>::Vector(&VStack_88,&local_70);
    if (cVar2 == '\x01') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,(Vector3d *)&VStack_88);
    }
    dVar3 = Vector<double,_3U>::length(&VStack_88);
    if (dVar3 < this->len_) {
      piVar1 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + (int)(dVar3 / this->deltaR_);
      *piVar1 = *piVar1 + 2;
    }
  }
  return;
}

Assistant:

void GofR::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    RealType distance = r12.length();

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      histogram_[whichBin] += 2;
    }
  }